

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

jpegls_errc
JpegLsEncode(void *destination,size_t destination_length,size_t *bytes_written,void *source,
            size_t source_length,JlsParameters *params,char *error_message)

{
  JlsParameters *pJVar1;
  void *pvVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  byte_span local_110;
  jpegls_pc_parameters local_fc;
  JpegLSPresetCodingParameters *local_e8;
  JpegLSPresetCodingParameters *pc;
  int32_t local_d8;
  int32_t local_d4;
  byte_span local_d0;
  undefined1 local_c0 [8];
  charls_jpegls_encoder encoder;
  JlsParameters *params_local;
  size_t source_length_local;
  void *source_local;
  size_t *bytes_written_local;
  size_t destination_length_local;
  void *destination_local;
  
  pJVar1 = charls::check_pointer<JlsParameters_const>(params);
  charls::check_argument((pJVar1->jfif).version == 0,InvalidJlsParameters);
  charls_jpegls_encoder::charls_jpegls_encoder((charls_jpegls_encoder *)local_c0);
  pvVar2 = charls::check_pointer<void>(destination);
  charls::byte_span::byte_span(&local_d0,pvVar2,destination_length);
  charls_jpegls_encoder::destination((charls_jpegls_encoder *)local_c0,local_d0);
  charls_jpegls_encoder::near_lossless((charls_jpegls_encoder *)local_c0,params->allowedLossyError);
  pc._0_4_ = params->width;
  pc._4_4_ = params->height;
  local_d8 = params->bitsPerSample;
  local_d4 = params->components;
  charls_jpegls_encoder::frame_info((charls_jpegls_encoder *)local_c0,(charls_frame_info *)&pc);
  charls_jpegls_encoder::interleave_mode((charls_jpegls_encoder *)local_c0,params->interleaveMode);
  charls_jpegls_encoder::color_transformation
            ((charls_jpegls_encoder *)local_c0,params->colorTransformation);
  local_e8 = &params->custom;
  local_fc.maximum_sample_value = local_e8->MaximumSampleValue;
  local_fc.threshold1 = (params->custom).Threshold1;
  local_fc.threshold2 = (params->custom).Threshold2;
  local_fc.threshold3 = (params->custom).Threshold3;
  local_fc.reset_value = (params->custom).ResetValue;
  charls_jpegls_encoder::preset_coding_parameters((charls_jpegls_encoder *)local_c0,&local_fc);
  pvVar2 = charls::check_pointer<void_const>(source);
  charls::byte_span::byte_span(&local_110,pvVar2,source_length);
  charls_jpegls_encoder::encode((charls_jpegls_encoder *)local_c0,local_110,(long)params->stride);
  sVar3 = charls_jpegls_encoder::bytes_written((charls_jpegls_encoder *)local_c0);
  puVar4 = charls::check_pointer<unsigned_long>(bytes_written);
  *puVar4 = sVar3;
  charls::clear_error_message(error_message);
  return OK;
}

Assistant:

USE_DECL_ANNOTATIONS jpegls_errc CHARLS_API_CALLING_CONVENTION
JpegLsEncode(void* destination, const size_t destination_length, size_t* bytes_written, const void* source,
             const size_t source_length, const JlsParameters* params, char* error_message) noexcept
try
{
    check_argument(check_pointer(params)->jfif.version == 0);

    charls_jpegls_encoder encoder;
    encoder.destination({check_pointer(destination), destination_length});
    encoder.near_lossless(params->allowedLossyError);

    encoder.frame_info({static_cast<uint32_t>(params->width), static_cast<uint32_t>(params->height), params->bitsPerSample,
                        params->components});
    encoder.interleave_mode(params->interleaveMode);
    encoder.color_transformation(params->colorTransformation);
    const auto& pc{params->custom};
    encoder.preset_coding_parameters({pc.MaximumSampleValue, pc.Threshold1, pc.Threshold2, pc.Threshold3, pc.ResetValue});

    encoder.encode({check_pointer(source), source_length}, static_cast<size_t>(params->stride));
    *check_pointer(bytes_written) = encoder.bytes_written();

    clear_error_message(error_message);
    return jpegls_errc::success;
}
catch (...)
{
    return set_error_message(to_jpegls_errc(), error_message);
}